

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Dequote(char *z)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  
  if ((z != (char *)0x0) && (bVar4 = *z, (char)""[bVar4] < '\0')) {
    bVar1 = 0x5d;
    if (bVar4 != 0x5b) {
      bVar1 = bVar4;
    }
    iVar3 = 1;
    uVar2 = 0;
    do {
      bVar4 = z[iVar3];
      if (z[iVar3] == bVar1) {
        if (z[(long)iVar3 + 1] != bVar1) {
          z[uVar2 & 0xffffffff] = '\0';
          return;
        }
        iVar3 = iVar3 + 1;
        bVar4 = bVar1;
      }
      z[uVar2] = bVar4;
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + 1;
    } while( true );
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Dequote(char *z){
  char quote;
  int i, j;
  if( z==0 ) return;
  quote = z[0];
  if( !sqlite3Isquote(quote) ) return;
  if( quote=='[' ) quote = ']';
  for(i=1, j=0;; i++){
    assert( z[i] );
    if( z[i]==quote ){
      if( z[i+1]==quote ){
        z[j++] = quote;
        i++;
      }else{
        break;
      }
    }else{
      z[j++] = z[i];
    }
  }
  z[j] = 0;
}